

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O2

void __thiscall serialization::xml_oarchive::serialize_start(xml_oarchive *this)

{
  xml_node<char> *child;
  
  rapidxml::xml_document<char>::clear(&this->document_);
  child = rapidxml::memory_pool<char>::allocate_node
                    (&(this->document_).super_memory_pool<char>,node_element,"serialization",
                     (char *)0x0,0,0);
  this->current_ = child;
  rapidxml::xml_node<char>::append_node((xml_node<char> *)this,child);
  (this->str_)._M_string_length = 0;
  *(this->str_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void serialize_start()
    {
        serialization_trace trace(__func__, "xml");
        document_.clear();
        current_ = document_.allocate_node(rapidxml::node_element, "serialization");
        document_.append_node(current_);
        str_.clear();
    }